

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O1

double __thiscall CppMLNN::loss(CppMLNN *this,MatrixXd *y_predict,MatrixXd *labels)

{
  Scalar SVar1;
  MatrixXd entropy;
  MatrixXd probs;
  scalar_sum_op<double,_double> local_81;
  MatrixXd local_80;
  double local_68;
  MatrixXd local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  redux_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_30;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)y_predict);
  softmax(&local_60,(CppMLNN *)y_predict,(MatrixXd *)&local_48);
  free(local_48.m_data);
  cross_entropy(&local_80,(CppMLNN *)y_predict,&local_60,labels);
  if ((0 < local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows) &&
     (0 < local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
     )) {
    local_30.m_evaluator.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.m_data =
         local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    local_30.m_evaluator.
    super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>.
    m_outerStride.m_value =
         local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
    local_30.m_xpr = &local_80;
    SVar1 = Eigen::internal::
            redux_impl<Eigen::internal::scalar_sum_op<double,_double>,_Eigen::internal::redux_evaluator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_3,_0>
            ::run(&local_30,&local_81);
    local_68 = SVar1 / (double)(local_80.
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_cols *
                               local_80.
                               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows);
    free(local_80.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    free(local_60.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
    ;
    return local_68;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/Redux.h"
                ,0x19d,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::Matrix<double, -1, -1>>::redux(const Func &) const [Derived = Eigen::Matrix<double, -1, -1>, BinaryOp = Eigen::internal::scalar_sum_op<double>]"
               );
}

Assistant:

double CppMLNN::loss(const MatrixXd &y_predict, const MatrixXd &labels) {
	MatrixXd probs = softmax(y_predict);
	MatrixXd entropy = cross_entropy(probs, labels);

	return entropy.mean();
}